

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::yarn5>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,yarn5 *r1,yarn5 *r2,long N,long skip1,long skip2)

{
  int iVar1;
  int iVar2;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>> *p_Var3
  ;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  uint local_d4;
  long local_d0;
  ulong local_c8;
  yarn5 *local_c0;
  yarn5 *local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_68;
  long local_50;
  long local_48;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_40;
  long local_38;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_c0 = r2;
  local_b8 = r1;
  local_50 = skip1;
  local_48 = skip2;
  local_40 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  local_38 = N;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve(&local_68,N);
    std::vector<int,_std::allocator<int>_>::reserve(&local_88,N);
    lVar9 = 0;
    local_c8 = 0xfffffffd;
    do {
      iVar8 = (local_b8->S).r[0];
      iVar1 = (local_b8->S).r[1];
      iVar2 = (local_b8->S).r[2];
      iVar11 = (local_b8->S).r[3];
      uVar12 = (long)(local_b8->P).a[3] * (long)iVar11 + (long)(local_b8->P).a[2] * (long)iVar2 +
               (long)(local_b8->P).a[1] * (long)iVar1 + (long)(local_b8->P).a[0] * (long)iVar8;
      uVar13 = uVar12 + 0x80000001fffffffe;
      if (uVar12 < 0x7ffffffe00000002) {
        uVar13 = uVar12;
      }
      uVar13 = (long)(local_b8->S).r[4] * (long)(local_b8->P).a[4] + uVar13;
      (local_b8->S).r[4] = iVar11;
      (local_b8->S).r[3] = iVar2;
      (local_b8->S).r[2] = iVar1;
      uVar12 = (uVar13 >> 0x1f) + (uVar13 & 0x7fffffff);
      uVar13 = uVar12 - 0x1fffffffc;
      if (uVar12 < 0x1fffffffc) {
        uVar13 = uVar12;
      }
      uVar12 = uVar13 - 0xfffffffe;
      if (uVar13 <= local_c8) {
        uVar12 = uVar13;
      }
      uVar7 = (uint)uVar12 + 0x80000001;
      if (uVar12 < 0x7fffffff) {
        uVar7 = (uint)uVar12;
      }
      (local_b8->S).r[1] = iVar8;
      (local_b8->S).r[0] = uVar7;
      local_d4 = 0;
      if (uVar7 != 0) {
        uVar4 = (uint)((ulong)*(uint *)(trng::yarn5::g + (ulong)(uVar7 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn5::g + (long)((int)uVar7 >> 0x10) * 4 + 0x40000)) &
                0x7fffffff;
        iVar8 = (int)((ulong)*(uint *)(trng::yarn5::g + (ulong)(uVar7 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn5::g + (long)((int)uVar7 >> 0x10) * 4 + 0x40000) >>
                     0x1f);
        uVar7 = uVar4 + iVar8;
        local_d4 = uVar4 + 0x80000001 + iVar8;
        if (uVar7 < 0x7fffffff) {
          local_d4 = uVar7;
        }
      }
      local_d0 = lVar9;
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_d4);
      }
      else {
        *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_d4;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar9 = local_d0;
      iVar8 = (local_c0->S).r[0];
      iVar1 = (local_c0->S).r[1];
      iVar2 = (local_c0->S).r[2];
      iVar11 = (local_c0->S).r[3];
      uVar12 = (long)(local_c0->P).a[3] * (long)iVar11 + (long)(local_c0->P).a[2] * (long)iVar2 +
               (long)(local_c0->P).a[1] * (long)iVar1 + (long)(local_c0->P).a[0] * (long)iVar8;
      uVar13 = uVar12 + 0x80000001fffffffe;
      if (uVar12 < 0x7ffffffe00000002) {
        uVar13 = uVar12;
      }
      uVar13 = (long)(local_c0->S).r[4] * (long)(local_c0->P).a[4] + uVar13;
      (local_c0->S).r[4] = iVar11;
      (local_c0->S).r[3] = iVar2;
      uVar12 = (uVar13 >> 0x1f) + (uVar13 & 0x7fffffff);
      uVar13 = uVar12 - 0x1fffffffc;
      if (uVar12 < 0x1fffffffc) {
        uVar13 = uVar12;
      }
      uVar12 = uVar13 - 0xfffffffe;
      if (uVar13 <= local_c8) {
        uVar12 = uVar13;
      }
      (local_c0->S).r[2] = iVar1;
      (local_c0->S).r[1] = iVar8;
      uVar7 = (uint)uVar12 + 0x80000001;
      if (uVar12 < 0x7fffffff) {
        uVar7 = (uint)uVar12;
      }
      (local_c0->S).r[0] = uVar7;
      if (uVar7 == 0) {
        local_d4 = 0;
      }
      else {
        uVar4 = (uint)((ulong)*(uint *)(trng::yarn5::g + (ulong)(uVar7 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn5::g + (long)((int)uVar7 >> 0x10) * 4 + 0x40000)) &
                0x7fffffff;
        iVar8 = (int)((ulong)*(uint *)(trng::yarn5::g + (ulong)(uVar7 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn5::g + (long)((int)uVar7 >> 0x10) * 4 + 0x40000) >>
                     0x1f);
        uVar7 = uVar4 + iVar8;
        local_d4 = uVar4 + 0x80000001 + iVar8;
        if (uVar7 < 0x7fffffff) {
          local_d4 = uVar7;
        }
      }
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_d4);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_d4;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (0 < local_50) {
        local_90 = (long)(local_b8->P).a[0];
        local_98 = (long)(local_b8->P).a[1];
        local_a0 = (long)(local_b8->P).a[2];
        local_a8 = (long)(local_b8->P).a[3];
        local_b0 = (long)(local_b8->P).a[4];
        lVar9 = local_50;
        iVar8 = (local_b8->S).r[4];
        iVar1 = (local_b8->S).r[3];
        iVar2 = (local_b8->S).r[2];
        iVar11 = (local_b8->S).r[0];
        iVar10 = (local_b8->S).r[1];
        do {
          iVar5 = iVar10;
          iVar10 = iVar11;
          iVar14 = iVar2;
          iVar6 = iVar1;
          uVar12 = iVar6 * local_a8 + iVar14 * local_a0 + iVar5 * local_98 + iVar10 * local_90;
          uVar13 = uVar12 + 0x80000001fffffffe;
          if (uVar12 < 0x7ffffffe00000002) {
            uVar13 = uVar12;
          }
          uVar13 = iVar8 * local_b0 + uVar13;
          uVar12 = (uVar13 >> 0x1f) + (uVar13 & 0x7fffffff);
          uVar13 = uVar12 - 0x1fffffffc;
          if (uVar12 < 0x1fffffffc) {
            uVar13 = uVar12;
          }
          uVar12 = uVar13 - 0xfffffffe;
          if (uVar13 <= local_c8) {
            uVar12 = uVar13;
          }
          iVar11 = (int)uVar12 + -0x7fffffff;
          if (uVar12 < 0x7fffffff) {
            iVar11 = (int)uVar12;
          }
          lVar9 = lVar9 + -1;
          iVar8 = iVar6;
          iVar1 = iVar14;
          iVar2 = iVar5;
        } while (lVar9 != 0);
        (local_b8->S).r[4] = iVar6;
        (local_b8->S).r[3] = iVar14;
        (local_b8->S).r[2] = iVar5;
        (local_b8->S).r[1] = iVar10;
        (local_b8->S).r[0] = iVar11;
        lVar9 = local_d0;
      }
      if (0 < local_48) {
        local_90 = (long)(local_c0->P).a[0];
        local_98 = (long)(local_c0->P).a[1];
        local_a0 = (long)(local_c0->P).a[2];
        local_a8 = (long)(local_c0->P).a[3];
        local_b0 = (long)(local_c0->P).a[4];
        lVar9 = local_48;
        iVar8 = (local_c0->S).r[4];
        iVar1 = (local_c0->S).r[3];
        iVar2 = (local_c0->S).r[2];
        iVar11 = (local_c0->S).r[0];
        iVar10 = (local_c0->S).r[1];
        do {
          iVar14 = iVar10;
          iVar10 = iVar11;
          iVar5 = iVar2;
          iVar6 = iVar1;
          uVar12 = iVar6 * local_a8 + iVar5 * local_a0 + iVar14 * local_98 + iVar10 * local_90;
          uVar13 = uVar12 + 0x80000001fffffffe;
          if (uVar12 < 0x7ffffffe00000002) {
            uVar13 = uVar12;
          }
          uVar13 = iVar8 * local_b0 + uVar13;
          uVar12 = (uVar13 >> 0x1f) + (uVar13 & 0x7fffffff);
          uVar13 = uVar12 - 0x1fffffffc;
          if (uVar12 < 0x1fffffffc) {
            uVar13 = uVar12;
          }
          uVar12 = uVar13 - 0xfffffffe;
          if (uVar13 <= local_c8) {
            uVar12 = uVar13;
          }
          iVar11 = (int)uVar12 + -0x7fffffff;
          if (uVar12 < 0x7fffffff) {
            iVar11 = (int)uVar12;
          }
          lVar9 = lVar9 + -1;
          iVar8 = iVar6;
          iVar1 = iVar5;
          iVar2 = iVar14;
        } while (lVar9 != 0);
        (local_c0->S).r[4] = iVar6;
        (local_c0->S).r[3] = iVar5;
        (local_c0->S).r[2] = iVar14;
        (local_c0->S).r[1] = iVar10;
        (local_c0->S).r[0] = iVar11;
        lVar9 = local_d0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != local_38);
  }
  p_Var3 = local_40;
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_40,&local_68,&local_88);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         p_Var3;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}